

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O3

void __thiscall
fmt::v8::detail::format_dragon
          (detail *this,fp value,bool is_predecessor_closer,int num_digits,buffer<char> *buf,
          int *exp10)

{
  uint *puVar1;
  uint *puVar2;
  uint *puVar3;
  uint *puVar4;
  char cVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  undefined7 in_register_00000009;
  ulong uVar10;
  uint uVar11;
  bigint *this_00;
  bigint *lhs2;
  long lVar12;
  undefined4 in_register_00000084;
  undefined8 *puVar13;
  uint64_t value_00;
  ulong uVar14;
  int iVar15;
  bigint denominator;
  bigint numerator;
  bigint lower;
  bigint upper_store;
  bigint local_2f0;
  bigint local_240;
  bigint local_190;
  bigint local_e0;
  
  puVar13 = (undefined8 *)CONCAT44(in_register_00000084,num_digits);
  uVar14 = CONCAT71(in_register_00000009,is_predecessor_closer);
  uVar10 = uVar14 & 0xffffffff;
  local_240.bigits_.super_buffer<unsigned_int>.size_ = 0;
  local_240.bigits_.super_buffer<unsigned_int>._vptr_buffer = (_func_int **)&PTR_grow_00239c08;
  puVar1 = local_240.bigits_.store_;
  local_240.bigits_.super_buffer<unsigned_int>.capacity_ = 0x20;
  local_240.exp_ = 0;
  local_2f0.bigits_.super_buffer<unsigned_int>.size_ = 0;
  local_2f0.bigits_.super_buffer<unsigned_int>._vptr_buffer = (_func_int **)&PTR_grow_00239c08;
  puVar2 = local_2f0.bigits_.store_;
  local_2f0.bigits_.super_buffer<unsigned_int>.capacity_ = 0x20;
  local_2f0.exp_ = 0;
  local_190.bigits_.super_buffer<unsigned_int>.size_ = 0;
  local_190.bigits_.super_buffer<unsigned_int>._vptr_buffer = (_func_int **)&PTR_grow_00239c08;
  puVar3 = local_190.bigits_.store_;
  local_190.bigits_.super_buffer<unsigned_int>.capacity_ = 0x20;
  local_190.exp_ = 0;
  this_00 = &local_e0;
  local_e0.bigits_.super_buffer<unsigned_int>.size_ = 0;
  local_e0.bigits_.super_buffer<unsigned_int>._vptr_buffer = (_func_int **)&PTR_grow_00239c08;
  puVar4 = local_e0.bigits_.store_;
  local_e0.bigits_.super_buffer<unsigned_int>.capacity_ = 0x20;
  local_e0.exp_ = 0;
  iVar15 = value.e + 1;
  value_00 = (long)this << ((byte)iVar15 & 0x3f);
  iVar6 = (int)value.f;
  cVar5 = (char)value.e;
  local_2f0.bigits_.super_buffer<unsigned_int>.ptr_ = puVar2;
  local_240.bigits_.super_buffer<unsigned_int>.ptr_ = puVar1;
  local_190.bigits_.super_buffer<unsigned_int>.ptr_ = puVar3;
  local_e0.bigits_.super_buffer<unsigned_int>.ptr_ = puVar4;
  if (iVar6 < 0) {
    if (*(int *)&buf->_vptr_buffer < 0) {
      bigint::assign_pow10(&local_240,-*(int *)&buf->_vptr_buffer);
      bigint::assign(&local_190,&local_240);
      if (cVar5 == '\0') {
        this_00 = (bigint *)0x0;
      }
      else {
        this_00 = &local_e0;
        bigint::assign(this_00,&local_240);
        bigint::operator<<=(this_00,1);
      }
      bigint::multiply(&local_240,value_00);
      bigint::assign(&local_2f0,1);
      bigint::operator<<=(&local_2f0,iVar15 - iVar6);
    }
    else {
      bigint::assign(&local_240,value_00);
      bigint::assign_pow10(&local_2f0,*(int *)&buf->_vptr_buffer);
      bigint::operator<<=(&local_2f0,iVar15 - iVar6);
      bigint::assign(&local_190,1);
      if (cVar5 == '\0') {
        this_00 = (bigint *)0x0;
      }
      else {
        bigint::assign(this_00,2);
      }
    }
  }
  else {
    bigint::assign(&local_240,value_00);
    bigint::operator<<=(&local_240,iVar6);
    bigint::assign(&local_190,1);
    bigint::operator<<=(&local_190,iVar6);
    if (cVar5 == '\0') {
      this_00 = (bigint *)0x0;
    }
    else {
      this_00 = &local_e0;
      bigint::assign(this_00,1);
      bigint::operator<<=(this_00,iVar6 + 1);
    }
    bigint::assign_pow10(&local_2f0,*(int *)&buf->_vptr_buffer);
    bigint::operator<<=(&local_2f0,iVar15);
  }
  iVar6 = (int)uVar14;
  if (-1 < iVar6) {
    *(int *)&buf->_vptr_buffer = *(int *)&buf->_vptr_buffer - (iVar6 + -1);
    uVar11 = iVar6 - 1;
    if (iVar6 == 0) {
      bigint::multiply(&local_2f0,10);
      iVar6 = add_compare(&local_240,&local_240,&local_2f0);
      lVar8 = puVar13[2];
      uVar14 = lVar8 + 1;
      if ((ulong)puVar13[3] < uVar14) {
        (**(code **)*puVar13)(puVar13);
        lVar8 = puVar13[2];
        uVar14 = lVar8 + 1;
      }
      puVar13[2] = uVar14;
      *(byte *)(puVar13[1] + lVar8) = 0 < iVar6 | 0x30;
    }
    else {
      uVar14 = uVar14 & 0xffffffff;
      uVar9 = puVar13[3];
      if (uVar9 < uVar14) {
        (**(code **)*puVar13)(puVar13,uVar14);
        uVar9 = puVar13[3];
      }
      if (uVar9 < uVar14) {
        uVar14 = uVar9;
      }
      puVar13[2] = uVar14;
      if (iVar6 != 1) {
        uVar14 = 0;
        do {
          iVar15 = bigint::divmod_assign(&local_240,&local_2f0);
          *(char *)(puVar13[1] + uVar14) = (char)iVar15 + '0';
          bigint::multiply(&local_240,10);
          uVar14 = uVar14 + 1;
        } while (uVar11 != uVar14);
      }
      uVar7 = bigint::divmod_assign(&local_240,&local_2f0);
      iVar15 = add_compare(&local_240,&local_240,&local_2f0);
      if ((0 < iVar15) || ((uVar7 & 1) != 0 && iVar15 == 0)) {
        if (uVar7 == 9) {
          *(undefined1 *)(puVar13[1] + (long)(int)uVar11) = 0x3a;
          if (iVar6 != 1) {
            uVar14 = (ulong)(iVar6 - 2);
            do {
              uVar11 = (int)uVar10 - 1;
              uVar10 = (ulong)uVar11;
              if (*(char *)(puVar13[1] + uVar10) != ':') break;
              *(undefined1 *)(puVar13[1] + uVar10) = 0x30;
              *(char *)(puVar13[1] + uVar14) = *(char *)(puVar13[1] + uVar14) + '\x01';
              uVar14 = uVar14 - 1;
            } while (1 < (int)uVar11);
          }
          if (*(char *)puVar13[1] == ':') {
            *(char *)puVar13[1] = '1';
            *(int *)&buf->_vptr_buffer = *(int *)&buf->_vptr_buffer + 1;
          }
          goto LAB_001e4c50;
        }
        uVar7 = uVar7 + 1;
      }
      *(char *)(puVar13[1] + (long)(int)uVar11) = (char)uVar7 + '0';
    }
    goto LAB_001e4c50;
  }
  lhs2 = this_00;
  if (this_00 == (bigint *)0x0) {
    lhs2 = &local_190;
  }
  lVar8 = puVar13[1];
  uVar11 = ~(uint)this & 1;
  lVar12 = 0;
  while( true ) {
    uVar7 = bigint::divmod_assign(&local_240,&local_2f0);
    iVar6 = compare(&local_240,&local_190);
    iVar15 = add_compare(&local_240,lhs2,&local_2f0);
    *(char *)(lVar8 + lVar12) = (char)uVar7 + '0';
    if ((iVar6 < (int)uVar11) || ((int)-uVar11 < iVar15)) break;
    bigint::multiply(&local_240,10);
    bigint::multiply(&local_190,10);
    if (this_00 != (bigint *)0x0) {
      bigint::multiply(this_00,10);
    }
    lVar12 = lVar12 + 1;
  }
  if (iVar6 < (int)uVar11) {
    if ((int)-uVar11 < iVar15) {
      iVar6 = add_compare(&local_240,&local_240,&local_2f0);
      if ((0 < iVar6) || ((uVar7 & 1) != 0 && iVar6 == 0)) {
        cVar5 = *(char *)(lVar8 + lVar12) + '\x01';
        goto LAB_001e4b92;
      }
    }
  }
  else {
    cVar5 = (char)uVar7 + '1';
LAB_001e4b92:
    *(char *)(lVar8 + lVar12) = cVar5;
  }
  uVar10 = lVar12 + 1U & 0xffffffff;
  uVar14 = puVar13[3];
  if (uVar14 < uVar10) {
    (**(code **)*puVar13)(puVar13,uVar10);
    uVar14 = puVar13[3];
  }
  if (uVar14 < uVar10) {
    uVar10 = uVar14;
  }
  puVar13[2] = uVar10;
  *(int *)&buf->_vptr_buffer = *(int *)&buf->_vptr_buffer - (int)lVar12;
LAB_001e4c50:
  if (local_e0.bigits_.super_buffer<unsigned_int>.ptr_ != puVar4) {
    operator_delete(local_e0.bigits_.super_buffer<unsigned_int>.ptr_,
                    local_e0.bigits_.super_buffer<unsigned_int>.capacity_ << 2);
  }
  if (local_190.bigits_.super_buffer<unsigned_int>.ptr_ != puVar3) {
    operator_delete(local_190.bigits_.super_buffer<unsigned_int>.ptr_,
                    local_190.bigits_.super_buffer<unsigned_int>.capacity_ << 2);
  }
  if (local_2f0.bigits_.super_buffer<unsigned_int>.ptr_ != puVar2) {
    operator_delete(local_2f0.bigits_.super_buffer<unsigned_int>.ptr_,
                    local_2f0.bigits_.super_buffer<unsigned_int>.capacity_ << 2);
  }
  if (local_240.bigits_.super_buffer<unsigned_int>.ptr_ != puVar1) {
    operator_delete(local_240.bigits_.super_buffer<unsigned_int>.ptr_,
                    local_240.bigits_.super_buffer<unsigned_int>.capacity_ << 2);
  }
  return;
}

Assistant:

FMT_CONSTEXPR20 inline void format_dragon(fp value, bool is_predecessor_closer,
                                          int num_digits, buffer<char>& buf,
                                          int& exp10) {
  bigint numerator;    // 2 * R in (FPP)^2.
  bigint denominator;  // 2 * S in (FPP)^2.
  // lower and upper are differences between value and corresponding boundaries.
  bigint lower;             // (M^- in (FPP)^2).
  bigint upper_store;       // upper's value if different from lower.
  bigint* upper = nullptr;  // (M^+ in (FPP)^2).
  // Shift numerator and denominator by an extra bit or two (if lower boundary
  // is closer) to make lower and upper integers. This eliminates multiplication
  // by 2 during later computations.
  int shift = is_predecessor_closer ? 2 : 1;
  uint64_t significand = value.f << shift;
  if (value.e >= 0) {
    numerator.assign(significand);
    numerator <<= value.e;
    lower.assign(1);
    lower <<= value.e;
    if (shift != 1) {
      upper_store.assign(1);
      upper_store <<= value.e + 1;
      upper = &upper_store;
    }
    denominator.assign_pow10(exp10);
    denominator <<= shift;
  } else if (exp10 < 0) {
    numerator.assign_pow10(-exp10);
    lower.assign(numerator);
    if (shift != 1) {
      upper_store.assign(numerator);
      upper_store <<= 1;
      upper = &upper_store;
    }
    numerator *= significand;
    denominator.assign(1);
    denominator <<= shift - value.e;
  } else {
    numerator.assign(significand);
    denominator.assign_pow10(exp10);
    denominator <<= shift - value.e;
    lower.assign(1);
    if (shift != 1) {
      upper_store.assign(1ULL << 1);
      upper = &upper_store;
    }
  }
  // Invariant: value == (numerator / denominator) * pow(10, exp10).
  if (num_digits < 0) {
    // Generate the shortest representation.
    if (!upper) upper = &lower;
    bool even = (value.f & 1) == 0;
    num_digits = 0;
    char* data = buf.data();
    for (;;) {
      int digit = numerator.divmod_assign(denominator);
      bool low = compare(numerator, lower) - even < 0;  // numerator <[=] lower.
      // numerator + upper >[=] pow10:
      bool high = add_compare(numerator, *upper, denominator) + even > 0;
      data[num_digits++] = static_cast<char>('0' + digit);
      if (low || high) {
        if (!low) {
          ++data[num_digits - 1];
        } else if (high) {
          int result = add_compare(numerator, numerator, denominator);
          // Round half to even.
          if (result > 0 || (result == 0 && (digit % 2) != 0))
            ++data[num_digits - 1];
        }
        buf.try_resize(to_unsigned(num_digits));
        exp10 -= num_digits - 1;
        return;
      }
      numerator *= 10;
      lower *= 10;
      if (upper != &lower) *upper *= 10;
    }
  }
  // Generate the given number of digits.
  exp10 -= num_digits - 1;
  if (num_digits == 0) {
    denominator *= 10;
    auto digit = add_compare(numerator, numerator, denominator) > 0 ? '1' : '0';
    buf.push_back(digit);
    return;
  }
  buf.try_resize(to_unsigned(num_digits));
  for (int i = 0; i < num_digits - 1; ++i) {
    int digit = numerator.divmod_assign(denominator);
    buf[i] = static_cast<char>('0' + digit);
    numerator *= 10;
  }
  int digit = numerator.divmod_assign(denominator);
  auto result = add_compare(numerator, numerator, denominator);
  if (result > 0 || (result == 0 && (digit % 2) != 0)) {
    if (digit == 9) {
      const auto overflow = '0' + 10;
      buf[num_digits - 1] = overflow;
      // Propagate the carry.
      for (int i = num_digits - 1; i > 0 && buf[i] == overflow; --i) {
        buf[i] = '0';
        ++buf[i - 1];
      }
      if (buf[0] == overflow) {
        buf[0] = '1';
        ++exp10;
      }
      return;
    }
    ++digit;
  }
  buf[num_digits - 1] = static_cast<char>('0' + digit);
}